

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void __thiscall CClient::ProcessServerPacket(CClient *this,CNetChunk *pPacket)

{
  CUnpacker *pCVar1;
  CPacker *pCVar2;
  CSnapshot *pSnapshot;
  CSnapshotStorage CVar3;
  char cVar4;
  void *pvVar5;
  IGameClient *pIVar6;
  _func_int *p_Var7;
  IMapChecker *pIVar8;
  IOHANDLE pIVar9;
  IStorage *pIVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  undefined1 *puVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  char *pcVar24;
  SHA256_DIGEST *pSVar25;
  uchar *puVar26;
  char *pcVar27;
  undefined4 extraout_var;
  SHA256_DIGEST *pSVar28;
  _func_int **pp_Var29;
  int64 iVar30;
  undefined4 extraout_var_00;
  CData *pSrcData;
  long lVar31;
  int64 iVar32;
  int64 iVar33;
  int64 iVar34;
  undefined1 *puVar35;
  uint uVar36;
  char *pcVar37;
  undefined8 uVar38;
  CClient *this_00;
  IConsole *pIVar39;
  int in_R9D;
  long lVar40;
  long in_FS_OFFSET;
  undefined1 auVar41 [16];
  CSnapshot *pDeltaShot;
  CUnpacker Unpacker;
  char aBuf_2 [256];
  char aBuf [256];
  CMsgPacker Msg;
  
  puVar17 = &stack0xffffffffffffffd0;
  do {
    puVar35 = puVar17;
    *(undefined8 *)(puVar35 + -0x1000) = 0;
    puVar17 = puVar35 + -0x1000;
  } while (puVar35 + -0x1000 != aBuf + 8);
  *(undefined8 *)(puVar35 + 0x1eff8) = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pvVar5 = pPacket->m_pData;
  iVar20 = pPacket->m_DataSize;
  *(undefined8 *)(puVar35 + -0x1160) = 0x121539;
  CUnpacker::Reset((CUnpacker *)(puVar35 + -0x1128),pvVar5,iVar20);
  *(undefined8 *)(puVar35 + -0x1160) = 0x121541;
  uVar18 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
  if (*(int *)(puVar35 + -0x1110) != 0) goto LAB_00121548;
  uVar36 = (int)uVar18 >> 1;
  uVar19 = pPacket->m_Flags;
  if ((uVar18 & 1) == 0) {
    if ((uVar19 & 1) != 0) {
      pIVar6 = this->m_pGameClient;
      p_Var7 = (pIVar6->super_IInterface)._vptr_IInterface[0xd];
      *(undefined8 *)(puVar35 + -0x1160) = 0x121593;
      (*p_Var7)(pIVar6,(ulong)uVar36,puVar35 + -0x1128);
      if ((this->m_RecordGameMessage == true) && ((this->m_DemoRecorder).m_File != (IOHANDLE)0x0)) {
        pvVar5 = pPacket->m_pData;
        iVar20 = pPacket->m_DataSize;
        *(undefined8 *)(puVar35 + -0x1160) = 0x1215bd;
        CDemoRecorder::RecordMessage(&this->m_DemoRecorder,pvVar5,iVar20);
      }
    }
    goto LAB_00121548;
  }
  if (uVar36 == 2 && (uVar19 & 1) != 0) {
    pCVar1 = (CUnpacker *)(puVar35 + -0x1128);
    *(undefined8 *)(puVar35 + -0x1160) = 0x1215e7;
    pcVar24 = CUnpacker::GetString(pCVar1,6);
    *(undefined8 *)(puVar35 + -0x1160) = 0x1215f2;
    uVar18 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar35 + -0x1160) = 0x1215fc;
    uVar19 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121607;
    iVar20 = CUnpacker::GetInt(pCVar1);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121612;
    iVar21 = CUnpacker::GetInt(pCVar1);
    if (*(int *)(puVar35 + -0x1110) == 0) {
      *(int *)(puVar35 + -0x1140) = iVar21;
      *(undefined8 *)(puVar35 + -0x1160) = 0x121630;
      pSVar25 = (SHA256_DIGEST *)CUnpacker::GetRaw((CUnpacker *)(puVar35 + -0x1128),0x20);
      pIVar8 = this->m_pMapChecker;
      p_Var7 = (pIVar8->super_IInterface)._vptr_IInterface[3];
      *(undefined8 *)(puVar35 + -0x1160) = 0x12164b;
      iVar21 = (*p_Var7)(pIVar8,pcVar24,pSVar25,(ulong)uVar18,(ulong)uVar19);
      pcVar37 = (char *)0x0;
      pcVar27 = pcVar24;
      if ((char)iVar21 == '\0') {
        pcVar37 = "invalid standard map";
      }
      do {
        cVar4 = *pcVar27;
        if ((cVar4 == '/') || (cVar4 == '\\')) {
          pcVar37 = "strange character in map name";
        }
        else if (cVar4 == '\0') goto LAB_0012187d;
        pcVar27 = pcVar27 + 1;
      } while( true );
    }
    goto LAB_00121548;
  }
  if (uVar36 != 3 || (uVar19 & 1) == 0) {
    if (uVar36 == 4 && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x1217fe;
      memset((CServerInfo *)(puVar35 + 0xeff8),0,0x228c);
      this_00 = (CClient *)&pPacket->m_Address;
      *(undefined8 *)(puVar35 + -0x1160) = 0x12181c;
      net_addr_str((NETADDR *)this_00,puVar35 + 0xf154,0x30,1);
      *(undefined8 *)(puVar35 + -0x1160) = 0x12182e;
      iVar20 = UnpackServerInfo(this_00,(CUnpacker *)(puVar35 + -0x1128),
                                (CServerInfo *)(puVar35 + 0xeff8),(int *)0x0);
      if (iVar20 == 0 && *(int *)(puVar35 + -0x1110) == 0) {
        *(undefined8 *)(puVar35 + -0x1160) = 0x121848;
        SortClients((CServerInfo *)(puVar35 + 0xeff8));
        *(undefined8 *)(puVar35 + -0x1160) = 0x12185c;
        mem_copy(&this->m_CurrentServerInfo,(CServerInfo *)(puVar35 + 0xeff8),0x228c);
        *(undefined8 *)((this->m_CurrentServerInfo).m_NetAddr.ip + 0xc) =
             *(undefined8 *)((this->m_ServerAddress).ip + 0xc);
        uVar13 = (this->m_ServerAddress).ip[0];
        uVar14 = (this->m_ServerAddress).ip[1];
        uVar15 = (this->m_ServerAddress).ip[2];
        uVar16 = (this->m_ServerAddress).ip[3];
        uVar38 = *(undefined8 *)((this->m_ServerAddress).ip + 4);
        (this->m_CurrentServerInfo).m_NetAddr.type = (this->m_ServerAddress).type;
        (this->m_CurrentServerInfo).m_NetAddr.ip[0] = uVar13;
        (this->m_CurrentServerInfo).m_NetAddr.ip[1] = uVar14;
        (this->m_CurrentServerInfo).m_NetAddr.ip[2] = uVar15;
        (this->m_CurrentServerInfo).m_NetAddr.ip[3] = uVar16;
        *(undefined8 *)((this->m_CurrentServerInfo).m_NetAddr.ip + 4) = uVar38;
      }
      goto LAB_00121548;
    }
    if (uVar36 == 5 && (uVar19 & 1) != 0) {
      p_Var7 = (this->m_pGameClient->super_IInterface)._vptr_IInterface[0xc];
      *(undefined8 *)(puVar35 + -0x1160) = 0x1218bd;
      (*p_Var7)();
      goto LAB_00121548;
    }
    if (uVar36 == 0x1a) {
      pCVar2 = (CPacker *)(puVar35 + 0xeff8);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121a9e;
      CPacker::Reset(pCVar2);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121aab;
      CPacker::AddInt(pCVar2,0x37);
      p_Var7 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
      *(undefined8 *)(puVar35 + -0x1160) = 0x121abc;
      (*p_Var7)(this,pCVar2,0);
      goto LAB_00121548;
    }
    if (uVar36 == 0xe && (uVar19 & 1) != 0) {
      pCVar1 = (CUnpacker *)(puVar35 + -0x1128);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121b1c;
      pcVar24 = CUnpacker::GetString(pCVar1,2);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121b2c;
      pcVar27 = CUnpacker::GetString(pCVar1,2);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121b3c;
      pcVar37 = CUnpacker::GetString(pCVar1,2);
      if (*(int *)(puVar35 + -0x1110) == 0) {
        pIVar39 = this->m_pConsole;
        p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[9];
        *(undefined8 *)(puVar35 + -0x1160) = 0x121b64;
        (*p_Var7)(pIVar39,pcVar24,pcVar37,4,pcVar27);
      }
      goto LAB_00121548;
    }
    if (uVar36 == 0xf && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x121bfe;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar35 + -0x1128),2);
      if (*(int *)(puVar35 + -0x1110) == 0) {
        pIVar39 = this->m_pConsole;
        p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[10];
        *(undefined8 *)(puVar35 + -0x1160) = 0x121c19;
        (*p_Var7)(pIVar39,pcVar24);
      }
      goto LAB_00121548;
    }
    if (uVar36 == 0x1d && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x121c42;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar35 + -0x1128),2);
      if (*(int *)(puVar35 + -0x1110) == 0) {
        pIVar39 = this->m_pConsole;
        p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0xc];
        *(undefined8 *)(puVar35 + -0x1160) = 0x121c5d;
        (*p_Var7)(pIVar39,pcVar24);
      }
      goto LAB_00121548;
    }
    if (uVar36 == 0x1e && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x121c86;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar35 + -0x1128),2);
      if (*(int *)(puVar35 + -0x1110) == 0) {
        pIVar39 = this->m_pConsole;
        p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0xd];
        *(undefined8 *)(puVar35 + -0x1160) = 0x121ca1;
        (*p_Var7)(pIVar39,pcVar24);
      }
      goto LAB_00121548;
    }
    if (uVar36 == 0xb && (uVar19 & 1) != 0) {
      this->m_RconAuthed = 1;
      this->m_UseTempRconCommands = 1;
      goto LAB_00121548;
    }
    if (uVar36 == 0xc && (uVar19 & 1) != 0) {
      this->m_RconAuthed = 0;
      if (this->m_UseTempRconCommands != 0) {
        p_Var7 = (this->m_pConsole->super_IInterface)._vptr_IInterface[0xb];
        *(undefined8 *)(puVar35 + -0x1160) = 0x121d00;
        (*p_Var7)();
      }
      this->m_UseTempRconCommands = 0;
      p_Var7 = (this->m_pConsole->super_IInterface)._vptr_IInterface[0xe];
      *(undefined8 *)(puVar35 + -0x1160) = 0x121d17;
      (*p_Var7)();
      goto LAB_00121548;
    }
    if (uVar36 == 0xd && (uVar19 & 1) != 0) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x121d3e;
      pcVar24 = CUnpacker::GetString((CUnpacker *)(puVar35 + -0x1128),1);
      if (*(int *)(puVar35 + -0x1110) == 0) {
        pIVar6 = this->m_pGameClient;
        p_Var7 = (pIVar6->super_IInterface)._vptr_IInterface[3];
        *(undefined8 *)(puVar35 + -0x1160) = 0x121d56;
        (*p_Var7)(pIVar6,pcVar24);
      }
      goto LAB_00121548;
    }
    if (uVar36 == 10) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x121deb;
      iVar20 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
      *(undefined8 *)(puVar35 + -0x1160) = 0x121df6;
      iVar21 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
      lVar40 = 0;
      lVar31 = 0;
      do {
        if (*(int *)((long)&this->m_aInputs[0].m_Tick + lVar31) == iVar20) {
          lVar40 = *(long *)((long)&this->m_aInputs[0].m_PredictedTime + lVar31);
          *(undefined8 *)(puVar35 + -0x1160) = 0x12202f;
          iVar30 = time_get();
          lVar31 = *(long *)((long)&this->m_aInputs[0].m_Time + lVar31);
          *(float *)(puVar35 + -0x1140) = (float)(iVar21 + -10) / 1000.0;
          *(undefined8 *)(puVar35 + -0x1160) = 0x122056;
          iVar32 = time_freq();
          lVar40 = (iVar30 + lVar40) -
                   ((long)((float)iVar32 * *(float *)(puVar35 + -0x1140)) + lVar31);
          break;
        }
        lVar31 = lVar31 + 0x218;
      } while (lVar31 != 0x1a2c0);
      if (lVar40 != 0) {
        *(undefined8 *)(puVar35 + -0x1160) = 0x12209c;
        CSmoothTime::Update(&this->m_PredictedTime,&this->m_InputtimeMarginGraph,lVar40,iVar21,1);
      }
      goto LAB_00121548;
    }
    if (uVar36 == 0x1b) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x121d6e;
      iVar30 = time_get();
      *(float *)(puVar35 + -0x1140) = (float)((iVar30 - this->m_PingStartTime) * 1000);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121d8c;
      iVar30 = time_freq();
      pcVar24 = puVar35 + 0xeff8;
      *(undefined8 *)(puVar35 + -0x1160) = 0x121dc3;
      str_format(pcVar24,0x100,"latency %.2f",
                 (double)(*(float *)(puVar35 + -0x1140) / (float)iVar30));
      pIVar39 = this->m_pConsole;
      pp_Var29 = (pIVar39->super_IInterface)._vptr_IInterface;
      pcVar27 = "client/network";
      uVar38 = 0;
    }
    else {
      if ((uVar18 & 0xfffffffc) != 0xc && uVar36 != 8) goto LAB_00121548;
      *(undefined8 *)(puVar35 + -0x1160) = 0x121e45;
      iVar20 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
      *(ulong *)(puVar35 + -0x1140) = CONCAT44(extraout_var_00,iVar20);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121e52;
      iVar20 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
      if ((this->super_IClient).m_State < 2) goto LAB_00121548;
      iVar21 = 1;
      uVar19 = 0;
      uVar18 = 0;
      if (uVar36 == 6) {
        *(undefined8 *)(puVar35 + -0x1160) = 0x121e80;
        iVar21 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
        *(undefined8 *)(puVar35 + -0x1160) = 0x121e8b;
        uVar18 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
      }
      *(undefined4 *)(puVar35 + -0x1134) = 0;
      if (uVar36 != 7) {
        *(undefined8 *)(puVar35 + -0x1160) = 0x121ea8;
        iVar22 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
        *(int *)(puVar35 + -0x1134) = iVar22;
        *(undefined8 *)(puVar35 + -0x1160) = 0x121eb4;
        uVar19 = CUnpacker::GetInt((CUnpacker *)(puVar35 + -0x1128));
      }
      *(undefined8 *)(puVar35 + -0x1160) = 0x121ec4;
      puVar26 = CUnpacker::GetRaw((CUnpacker *)(puVar35 + -0x1128),uVar19);
      if (((((int)uVar18 < 0) || (iVar21 - 0x41U < 0xffffffc0)) ||
          (*(int *)(puVar35 + -0x1110) != 0)) || (900 < uVar19 || iVar21 <= (int)uVar18))
      goto LAB_00121548;
      iVar22 = (int)*(undefined8 *)(puVar35 + -0x1140);
      iVar20 = iVar22 - iVar20;
      if (iVar22 < this->m_CurrentRecvTick) goto LAB_00121548;
      if (iVar22 != this->m_CurrentRecvTick) {
        this->m_SnapshotParts = 0;
        this->m_CurrentRecvTick = (int)*(undefined8 *)(puVar35 + -0x1140);
      }
      *(undefined8 *)(puVar35 + -0x1160) = 0x121f4a;
      mem_copy(this->m_aSnapshotIncomingData + uVar18 * 900,puVar26,uVar19);
      uVar18 = this->m_SnapshotParts | 1 << (uVar18 & 0x1f);
      this->m_SnapshotParts = uVar18;
      if ((-1 << ((byte)iVar21 & 0x1f) ^ uVar18) != 0xffffffff) goto LAB_00121548;
      *(CSnapshot **)(puVar35 + -0x1130) = &ProcessServerPacket::Emptysnap;
      this->m_SnapshotParts = 0;
      ProcessServerPacket::Emptysnap.m_DataSize = 0;
      ProcessServerPacket::Emptysnap.m_NumItems = 0;
      if (-1 < iVar20) {
        *(undefined8 *)(puVar35 + -0x1160) = 0x121fae;
        iVar22 = CSnapshotStorage::Get
                           (&this->m_SnapshotStorage,iVar20,(int64 *)0x0,
                            (CSnapshot **)(puVar35 + -0x1130),(CSnapshot **)0x0);
        if (iVar22 < 0) {
          if (this->m_pConfig->m_Debug != 0) {
            *(undefined8 *)(puVar35 + -0x1160) = 0x122360;
            str_format(puVar35 + -0x1108,0x100,"error, couldn\'t find the delta snapshot");
            pIVar39 = this->m_pConsole;
            p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0x19];
            *(undefined8 *)(puVar35 + -0x1160) = 0x122382;
            (*p_Var7)(pIVar39,2,"client",puVar35 + -0x1108,0);
          }
          this->m_AckGameTick = -1;
          goto LAB_00121548;
        }
      }
      iVar21 = iVar21 * 900 + uVar19 + -900;
      *(undefined8 *)(puVar35 + -0x1160) = 0x121fd7;
      pSrcData = CSnapshotDelta::EmptyDelta(&this->m_SnapshotDelta);
      if (iVar21 == 0) {
        iVar22 = 0xc;
      }
      else {
        *(undefined8 *)(puVar35 + -0x1160) = 0x121fff;
        lVar31 = CVariableInt::Decompress
                           (this->m_aSnapshotIncomingData,iVar21,puVar35 + 0xeff8,0x10000);
        iVar23 = (int)lVar31;
        iVar22 = 0xc;
        if (-1 < iVar23) {
          iVar22 = iVar23;
        }
        pSrcData = (CData *)(puVar35 + 0xeff8);
        if (-1 >= iVar23) goto LAB_00121548;
      }
      *(undefined8 *)(puVar35 + -0x1160) = 0x1220c4;
      uVar18 = CSnapshotDelta::UnpackDelta
                         (&this->m_SnapshotDelta,*(CSnapshot **)(puVar35 + -0x1130),
                          (CSnapshot *)(puVar35 + -0x1008),pSrcData,iVar22);
      if (-1 < (int)uVar18) {
        if (uVar36 != 7) {
          *(undefined8 *)(puVar35 + -0x1160) = 0x1220e1;
          iVar22 = CSnapshot::Crc((CSnapshot *)(puVar35 + -0x1008));
          if (iVar22 != *(int *)(puVar35 + -0x1134)) {
            if (this->m_pConfig->m_Debug != 0) {
              uVar18 = this->m_SnapCrcErrors;
              *(undefined8 *)(puVar35 + -0x1160) = 0x1223ed;
              iVar22 = CSnapshot::Crc((CSnapshot *)(puVar35 + -0x1008));
              *(int *)(puVar35 + -0x1148) = iVar20;
              *(int *)(puVar35 + -0x1150) = iVar21;
              *(int *)(puVar35 + -0x1158) = iVar22;
              *(undefined8 *)(puVar35 + -0x1160) = 0x122421;
              str_format(puVar35 + -0x1108,0x100,
                         "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d"
                         ,(ulong)uVar18,*(undefined8 *)(puVar35 + -0x1140),
                         (ulong)*(uint *)(puVar35 + -0x1134));
              pIVar39 = this->m_pConsole;
              p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0x19];
              *(undefined8 *)(puVar35 + -0x1160) = 0x122443;
              (*p_Var7)(pIVar39,2,"client",puVar35 + -0x1108,0);
            }
            iVar20 = this->m_SnapCrcErrors;
            this->m_SnapCrcErrors = iVar20 + 1;
            if (9 < iVar20) {
              this->m_AckGameTick = -1;
              *(undefined8 *)(puVar35 + -0x1160) = 0x12246d;
              SendInput(this);
              this->m_SnapCrcErrors = 0;
            }
            goto LAB_00121548;
          }
        }
        if (this->m_SnapCrcErrors != 0) {
          this->m_SnapCrcErrors = this->m_SnapCrcErrors + -1;
        }
        if ((this->m_aSnapshots[1] != (CHolder *)0x0) &&
           (iVar21 = this->m_aSnapshots[1]->m_Tick, iVar21 < iVar20)) {
          iVar20 = iVar21;
        }
        if ((this->m_aSnapshots[0] != (CHolder *)0x0) &&
           (iVar21 = this->m_aSnapshots[0]->m_Tick, iVar21 < iVar20)) {
          iVar20 = iVar21;
        }
        *(undefined8 *)(puVar35 + -0x1160) = 0x12213b;
        CSnapshotStorage::PurgeUntil(&this->m_SnapshotStorage,iVar20);
        *(undefined8 *)(puVar35 + -0x1160) = 0x122140;
        iVar30 = time_get();
        *(undefined8 *)(puVar35 + -0x1160) = 0x122161;
        CSnapshotStorage::Add
                  (&this->m_SnapshotStorage,(int)*(undefined8 *)(puVar35 + -0x1140),iVar30,uVar18,
                   puVar35 + -0x1008,true);
        if ((this->m_DemoRecorder).m_File != (IOHANDLE)0x0) {
          pSnapshot = (CSnapshot *)(puVar35 + -0x1008);
          *(undefined8 *)(puVar35 + -0x1160) = 0x12218c;
          CSnapshotBuilder::Init(&this->m_DemoRecSnapshotBuilder,pSnapshot);
          p_Var7 = (this->m_pGameClient->super_IInterface)._vptr_IInterface[6];
          *(undefined8 *)(puVar35 + -0x1160) = 0x122196;
          (*p_Var7)();
          *(undefined8 *)(puVar35 + -0x1160) = 0x1221a1;
          iVar20 = CSnapshotBuilder::Finish(&this->m_DemoRecSnapshotBuilder,pSnapshot);
          *(undefined8 *)(puVar35 + -0x1160) = 0x1221b3;
          CDemoRecorder::RecordSnapshot
                    (&this->m_DemoRecorder,(int)*(undefined8 *)(puVar35 + -0x1140),pSnapshot,iVar20)
          ;
        }
        iVar20 = this->m_ReceivedSnapshots + 1;
        this->m_ReceivedSnapshots = iVar20;
        iVar21 = (int)*(undefined8 *)(puVar35 + -0x1140);
        this->m_CurrentRecvTick = iVar21;
        if (iVar20 == 2) {
          *(undefined8 *)(puVar35 + -0x1160) = 0x1221ee;
          iVar30 = time_freq();
          *(undefined8 *)(puVar35 + -0x1160) = 0x122214;
          CSmoothTime::Init(&this->m_PredictedTime,(iVar30 * iVar21) / 0x32);
          (this->m_PredictedTime).m_aAdjustSpeed[1] = 1000.0;
          uVar38 = *(undefined8 *)(puVar35 + -0x1140);
          *(undefined8 *)(puVar35 + -0x1160) = 0x122234;
          iVar30 = time_freq();
          *(undefined8 *)(puVar35 + -0x1160) = 0x12225a;
          CSmoothTime::Init(&this->m_GameTime,(((int)uVar38 + -1) * iVar30) / 0x32);
          CVar3 = this->m_SnapshotStorage;
          auVar41._0_8_ = CVar3.m_pLast;
          auVar41._8_4_ = (int)CVar3.m_pFirst;
          auVar41._12_4_ = CVar3.m_pFirst._4_4_;
          *(undefined1 (*) [16])this->m_aSnapshots = auVar41;
          *(undefined8 *)(puVar35 + -0x1160) = 0x12227c;
          SetState(this,3);
        }
        if (2 < this->m_ReceivedSnapshots) {
          *(undefined8 *)(puVar35 + -0x1160) = 0x122295;
          iVar30 = time_get();
          *(undefined8 *)(puVar35 + -0x1160) = 0x1222a0;
          iVar30 = CSmoothTime::Get(&this->m_GameTime,iVar30);
          *(undefined8 *)(puVar35 + -0x1160) = 0x1222a8;
          iVar32 = time_freq();
          *(undefined8 *)(puVar35 + -0x1160) = 0x1222d5;
          iVar33 = time_freq();
          uVar38 = *(undefined8 *)(puVar35 + -0x1140);
          *(undefined8 *)(puVar35 + -0x1160) = 0x1222f9;
          iVar34 = time_freq();
          *(undefined8 *)(puVar35 + -0x1160) = 0x122325;
          CSmoothTime::Update(&this->m_GameTime,&this->m_GametimeMarginGraph,
                              (((int)uVar38 + -1) * iVar34) / 0x32,
                              (int)((((iVar32 * iVar21) / 0x32 - iVar30) * 1000) / iVar33),0);
        }
        this->m_AckGameTick = (int)*(undefined8 *)(puVar35 + -0x1140);
        goto LAB_00121548;
      }
      pcVar24 = puVar35 + -0x1108;
      *(undefined8 *)(puVar35 + -0x1160) = 0x1223af;
      str_format(pcVar24,0x40,"delta unpack failed! (%d)",(ulong)uVar18);
      pIVar39 = this->m_pConsole;
      pp_Var29 = (pIVar39->super_IInterface)._vptr_IInterface;
      pcVar27 = "client";
      uVar38 = 2;
    }
    goto LAB_00121a7b;
  }
  if (this->m_MapdownloadFileTemp == (IOHANDLE)0x0) goto LAB_00121548;
  uVar18 = this->m_MapdownloadTotalsize - this->m_MapdownloadAmount;
  if (this->m_MapDownloadChunkSize < (int)uVar18) {
    uVar18 = this->m_MapDownloadChunkSize;
  }
  *(undefined8 *)(puVar35 + -0x1160) = 0x1216cc;
  puVar26 = CUnpacker::GetRaw((CUnpacker *)(puVar35 + -0x1128),uVar18);
  if (*(int *)(puVar35 + -0x1110) != 0) goto LAB_00121548;
  pIVar9 = this->m_MapdownloadFileTemp;
  *(undefined8 *)(puVar35 + -0x1160) = 0x1216e8;
  io_write(pIVar9,puVar26,uVar18);
  iVar20 = this->m_MapdownloadChunk + 1;
  this->m_MapdownloadChunk = iVar20;
  iVar21 = uVar18 + this->m_MapdownloadAmount;
  this->m_MapdownloadAmount = iVar21;
  if (iVar21 != this->m_MapdownloadTotalsize) {
    if (iVar20 % this->m_MapdownloadChunkNum != 0) goto LAB_00121548;
    pCVar2 = (CPacker *)(puVar35 + 0xeff8);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121b88;
    CPacker::Reset(pCVar2);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121b95;
    CPacker::AddInt(pCVar2,0x2f);
    p_Var7 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
    *(undefined8 *)(puVar35 + -0x1160) = 0x121ba9;
    (*p_Var7)(this,pCVar2,3);
    if (this->m_pConfig->m_Debug == 0) goto LAB_00121548;
    pIVar39 = this->m_pConsole;
    pp_Var29 = (pIVar39->super_IInterface)._vptr_IInterface;
    pcVar24 = "requested next chunk package";
    goto LAB_00121a76;
  }
  pIVar39 = this->m_pConsole;
  p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0x19];
  *(undefined8 *)(puVar35 + -0x1160) = 0x121734;
  (*p_Var7)(pIVar39,1,"client/network","download complete, loading map",0);
  pIVar9 = this->m_MapdownloadFileTemp;
  if (pIVar9 != (IOHANDLE)0x0) {
    *(undefined8 *)(puVar35 + -0x1160) = 0x121745;
    io_close(pIVar9);
  }
  this->m_MapdownloadFileTemp = (IOHANDLE)0x0;
  this->m_MapdownloadAmount = 0;
  this->m_MapdownloadTotalsize = -1;
  pIVar10 = this->m_pStorage;
  pcVar24 = this->m_aMapdownloadFilename;
  p_Var7 = (pIVar10->super_IInterface)._vptr_IInterface[9];
  *(undefined8 *)(puVar35 + -0x1160) = 0x121779;
  (*p_Var7)(pIVar10,pcVar24,0);
  pIVar10 = this->m_pStorage;
  p_Var7 = (pIVar10->super_IInterface)._vptr_IInterface[10];
  *(undefined8 *)(puVar35 + -0x1160) = 0x121792;
  (*p_Var7)(pIVar10,this->m_aMapdownloadFilenameTemp,pcVar24,0);
  pSVar25 = &this->m_MapdownloadSha256;
  if (this->m_MapdownloadSha256Present == false) {
    pSVar25 = (SHA256_DIGEST *)0x0;
  }
  uVar18 = this->m_MapdownloadCrc;
  *(undefined8 *)(puVar35 + -0x1160) = 0x1217bd;
  pcVar37 = LoadMap(this,this->m_aMapdownloadName,pcVar24,pSVar25,uVar18);
  if (pcVar37 == (char *)0x0) goto LAB_00121ac1;
LAB_00121893:
  *(undefined8 *)(puVar35 + -0x1160) = 0x121898;
  DisconnectWithReason(this,pcVar37);
LAB_00121548:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(puVar35 + 0x1eff8)) {
    return;
  }
  *(undefined8 *)(puVar35 + -0x1160) = 0x1220a6;
  __stack_chk_fail();
LAB_0012187d:
  if ((int)uVar19 < 1) {
    pcVar37 = "invalid map size";
  }
  if (pcVar37 == (char *)0x0) {
    *(undefined8 *)(puVar35 + -0x1160) = 0x1218d2;
    pcVar27 = LoadMapSearch(this,pcVar24,pSVar25,uVar18);
    if (pcVar27 == (char *)0x0) {
LAB_00121ac1:
      pIVar39 = this->m_pConsole;
      p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0x19];
      *(undefined8 *)(puVar35 + -0x1160) = 0x121ae7;
      (*p_Var7)(pIVar39,1,"client/network","loading done",0);
      *(undefined8 *)(puVar35 + -0x1160) = 0x121aef;
      SendReady(this);
      goto LAB_00121548;
    }
    *(int *)(puVar35 + -0x1134) = iVar20;
    pIVar9 = this->m_MapdownloadFileTemp;
    if (pIVar9 != (IOHANDLE)0x0) {
      *(undefined8 *)(puVar35 + -0x1160) = 0x1218f1;
      io_close(pIVar9);
      pIVar10 = this->m_pStorage;
      p_Var7 = (pIVar10->super_IInterface)._vptr_IInterface[9];
      *(undefined8 *)(puVar35 + -0x1160) = 0x121907;
      (*p_Var7)(pIVar10,this->m_aMapdownloadFilenameTemp,0);
    }
    *(undefined8 *)(puVar35 + -0x1160) = 0x12191d;
    FormatMapDownloadFilename(pcVar24,pSVar25,uVar18,false,this->m_aMapdownloadFilename,in_R9D);
    pcVar27 = this->m_aMapdownloadFilenameTemp;
    *(undefined8 *)(puVar35 + -0x1160) = 0x121939;
    FormatMapDownloadFilename(pcVar24,pSVar25,uVar18,true,pcVar27,in_R9D);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121957;
    str_format(puVar35 + -0x1008,0x100,"starting to download map to \'%s\'",pcVar27);
    pIVar39 = this->m_pConsole;
    p_Var7 = (pIVar39->super_IInterface)._vptr_IInterface[0x19];
    *(undefined8 *)(puVar35 + -0x1160) = 0x12197e;
    (*p_Var7)(pIVar39,1,"client/network",puVar35 + -0x1008,0);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121992;
    str_copy(this->m_aMapdownloadName,pcVar24,0x200);
    pIVar10 = this->m_pStorage;
    pp_Var29 = (pIVar10->super_IInterface)._vptr_IInterface;
    *(undefined8 *)(puVar35 + -0x1158) = 0;
    *(undefined8 *)(puVar35 + -0x1150) = 0;
    p_Var7 = pp_Var29[4];
    *(undefined8 *)(puVar35 + -0x1160) = 0x1219b6;
    iVar20 = (*p_Var7)(pIVar10,pcVar27,2,0,0,0);
    this->m_MapdownloadFileTemp = (IOHANDLE)CONCAT44(extraout_var,iVar20);
    this->m_MapdownloadChunk = 0;
    this->m_MapdownloadChunkNum = *(int *)(puVar35 + -0x1134);
    pSVar28 = &SHA256_ZEROED;
    if (pSVar25 != (SHA256_DIGEST *)0x0) {
      pSVar28 = pSVar25;
    }
    this->m_MapDownloadChunkSize = *(int *)(puVar35 + -0x1140);
    uVar38 = *(undefined8 *)(pSVar28->data + 8);
    uVar11 = *(undefined8 *)(pSVar28->data + 0x10);
    uVar12 = *(undefined8 *)(pSVar28->data + 0x18);
    *(undefined8 *)(this->m_MapdownloadSha256).data = *(undefined8 *)pSVar28->data;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 8) = uVar38;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 0x10) = uVar11;
    *(undefined8 *)((this->m_MapdownloadSha256).data + 0x18) = uVar12;
    this->m_MapdownloadSha256Present = pSVar25 != (SHA256_DIGEST *)0x0;
    this->m_MapdownloadCrc = uVar18;
    this->m_MapdownloadTotalsize = uVar19;
    this->m_MapdownloadAmount = 0;
    pCVar2 = (CPacker *)(puVar35 + 0xeff8);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121a29;
    CPacker::Reset(pCVar2);
    *(undefined8 *)(puVar35 + -0x1160) = 0x121a36;
    CPacker::AddInt(pCVar2,0x2f);
    p_Var7 = (this->super_IClient).super_IInterface._vptr_IInterface[0x24];
    *(undefined8 *)(puVar35 + -0x1160) = 0x121a4a;
    (*p_Var7)(this,pCVar2,3);
    if (this->m_pConfig->m_Debug == 0) goto LAB_00121548;
    pIVar39 = this->m_pConsole;
    pp_Var29 = (pIVar39->super_IInterface)._vptr_IInterface;
    pcVar24 = "requested first chunk package";
LAB_00121a76:
    pcVar27 = "client/network";
    uVar38 = 2;
LAB_00121a7b:
    p_Var7 = pp_Var29[0x19];
    *(undefined8 *)(puVar35 + -0x1160) = 0x121a84;
    (*p_Var7)(pIVar39,uVar38,pcVar27,pcVar24,0);
    goto LAB_00121548;
  }
  goto LAB_00121893;
}

Assistant:

void CClient::ProcessServerPacket(CNetChunk *pPacket)
{
	CUnpacker Unpacker;
	Unpacker.Reset(pPacket->m_pData, pPacket->m_DataSize);

	// unpack msgid and system flag
	int Msg = Unpacker.GetInt();
	int Sys = Msg&1;
	Msg >>= 1;

	if(Unpacker.Error())
		return;

	if(Sys)
	{
		// system message
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_CHANGE)
		{
			const char *pMap = Unpacker.GetString(CUnpacker::SANITIZE_CC|CUnpacker::SKIP_START_WHITESPACES);
			int MapCrc = Unpacker.GetInt();
			int MapSize = Unpacker.GetInt();
			int MapChunkNum = Unpacker.GetInt();
			int MapChunkSize = Unpacker.GetInt();
			if(Unpacker.Error())
				return;
			const SHA256_DIGEST *pMapSha256 = (const SHA256_DIGEST *)Unpacker.GetRaw(sizeof(*pMapSha256));
			const char *pError = 0;

			// check for valid standard map
			if(!m_pMapChecker->IsMapValid(pMap, pMapSha256, MapCrc, MapSize))
				pError = "invalid standard map";

			// protect the player from nasty map names
			for(int i = 0; pMap[i]; i++)
			{
				if(pMap[i] == '/' || pMap[i] == '\\')
					pError = "strange character in map name";
			}

			if(MapSize <= 0)
				pError = "invalid map size";

			if(pError)
				DisconnectWithReason(pError);
			else
			{
				pError = LoadMapSearch(pMap, pMapSha256, MapCrc);

				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
				{
					if(m_MapdownloadFileTemp)
					{
						io_close(m_MapdownloadFileTemp);
						Storage()->RemoveFile(m_aMapdownloadFilenameTemp, IStorage::TYPE_SAVE);
					}

					// start map download
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, false, m_aMapdownloadFilename, sizeof(m_aMapdownloadFilename));
					FormatMapDownloadFilename(pMap, pMapSha256, MapCrc, true, m_aMapdownloadFilenameTemp, sizeof(m_aMapdownloadFilenameTemp));

					char aBuf[256];
					str_format(aBuf, sizeof(aBuf), "starting to download map to '%s'", m_aMapdownloadFilenameTemp);
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", aBuf);

					str_copy(m_aMapdownloadName, pMap, sizeof(m_aMapdownloadName));
					m_MapdownloadFileTemp = Storage()->OpenFile(m_aMapdownloadFilenameTemp, IOFLAG_WRITE, IStorage::TYPE_SAVE);
					m_MapdownloadChunk = 0;
					m_MapdownloadChunkNum = MapChunkNum;
					m_MapDownloadChunkSize = MapChunkSize;
					m_MapdownloadSha256 = pMapSha256 ? *pMapSha256 : SHA256_ZEROED;
					m_MapdownloadSha256Present = pMapSha256;
					m_MapdownloadCrc = MapCrc;
					m_MapdownloadTotalsize = MapSize;
					m_MapdownloadAmount = 0;

					// request first chunk package of map data
					CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
					SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

					if(Config()->m_Debug)
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested first chunk package");
				}
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAP_DATA)
		{
			if(!m_MapdownloadFileTemp)
				return;

			int Size = minimum(m_MapDownloadChunkSize, m_MapdownloadTotalsize-m_MapdownloadAmount);
			const unsigned char *pData = Unpacker.GetRaw(Size);
			if(Unpacker.Error())
				return;

			io_write(m_MapdownloadFileTemp, pData, Size);
			++m_MapdownloadChunk;
			m_MapdownloadAmount += Size;

			if(m_MapdownloadAmount == m_MapdownloadTotalsize)
			{
				// map download complete
				m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "download complete, loading map");

				if(m_MapdownloadFileTemp)
					io_close(m_MapdownloadFileTemp);
				m_MapdownloadFileTemp = 0;
				m_MapdownloadAmount = 0;
				m_MapdownloadTotalsize = -1;

				Storage()->RemoveFile(m_aMapdownloadFilename, IStorage::TYPE_SAVE);
				Storage()->RenameFile(m_aMapdownloadFilenameTemp, m_aMapdownloadFilename, IStorage::TYPE_SAVE);

				// load map
				const char *pError = LoadMap(m_aMapdownloadName, m_aMapdownloadFilename, m_MapdownloadSha256Present ? &m_MapdownloadSha256 : 0, m_MapdownloadCrc);
				if(!pError)
				{
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_ADDINFO, "client/network", "loading done");
					SendReady();
				}
				else
					DisconnectWithReason(pError);
			}
			else if(m_MapdownloadChunk%m_MapdownloadChunkNum == 0)
			{
				// request next chunk package of map data
				CMsgPacker Msg(NETMSG_REQUEST_MAP_DATA, true);
				SendMsg(&Msg, MSGFLAG_VITAL|MSGFLAG_FLUSH);

				if(Config()->m_Debug)
					m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client/network", "requested next chunk package");
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_SERVERINFO)
		{
			CServerInfo Info = {0};
			net_addr_str(&pPacket->m_Address, Info.m_aAddress, sizeof(Info.m_aAddress), true);
			if(!UnpackServerInfo(&Unpacker, &Info, 0) && !Unpacker.Error())
			{
				SortClients(&Info);
				mem_copy(&m_CurrentServerInfo, &Info, sizeof(m_CurrentServerInfo));
				m_CurrentServerInfo.m_NetAddr = m_ServerAddress;
			}
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_CON_READY)
		{
			GameClient()->OnConnected();
		}
		else if(Msg == NETMSG_PING)
		{
			CMsgPacker Msg(NETMSG_PING_REPLY, true);
			SendMsg(&Msg, 0);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pHelp = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			const char *pParams = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTemp(pName, pParams, CFGFLAG_SERVER, pHelp);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_CMD_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTemp(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_ADD)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->RegisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_MAPLIST_ENTRY_REM)
		{
			const char *pName = Unpacker.GetString(CUnpacker::SANITIZE_CC);
			if(Unpacker.Error() == 0)
				m_pConsole->DeregisterTempMap(pName);
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_ON)
		{
			m_RconAuthed = 1;
			m_UseTempRconCommands = 1;
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_AUTH_OFF)
		{
			m_RconAuthed = 0;
			if(m_UseTempRconCommands)
				m_pConsole->DeregisterTempAll();
			m_UseTempRconCommands = 0;
			m_pConsole->DeregisterTempMapAll();
		}
		else if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0 && Msg == NETMSG_RCON_LINE)
		{
			const char *pLine = Unpacker.GetString();
			if(Unpacker.Error() == 0)
				GameClient()->OnRconLine(pLine);
		}
		else if(Msg == NETMSG_PING_REPLY)
		{
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "latency %.2f", (time_get() - m_PingStartTime)*1000 / (float)time_freq());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client/network", aBuf);
		}
		else if(Msg == NETMSG_INPUTTIMING)
		{
			int InputPredTick = Unpacker.GetInt();
			int TimeLeft = Unpacker.GetInt();

			// adjust our prediction time
			int64 Target = 0;
			for(int k = 0; k < 200; k++)
			{
				if(m_aInputs[k].m_Tick == InputPredTick)
				{
					Target = m_aInputs[k].m_PredictedTime + (time_get() - m_aInputs[k].m_Time);
					Target = Target - (int64)(((TimeLeft-PREDICTION_MARGIN)/1000.0f)*time_freq());
					break;
				}
			}

			if(Target)
				m_PredictedTime.Update(&m_InputtimeMarginGraph, Target, TimeLeft, 1);
		}
		else if(Msg == NETMSG_SNAP || Msg == NETMSG_SNAPSINGLE || Msg == NETMSG_SNAPEMPTY)
		{
			int NumParts = 1;
			int Part = 0;
			int GameTick = Unpacker.GetInt();
			int DeltaTick = GameTick-Unpacker.GetInt();
			int PartSize = 0;
			int Crc = 0;
			int CompleteSize = 0;
			const char *pData = 0;

			// we are not allowed to process snapshot yet
			if(State() < IClient::STATE_LOADING)
				return;

			if(Msg == NETMSG_SNAP)
			{
				NumParts = Unpacker.GetInt();
				Part = Unpacker.GetInt();
			}

			if(Msg != NETMSG_SNAPEMPTY)
			{
				Crc = Unpacker.GetInt();
				PartSize = Unpacker.GetInt();
			}

			pData = (const char *)Unpacker.GetRaw(PartSize);

			if(Unpacker.Error() || NumParts < 1 || NumParts > CSnapshot::MAX_PARTS || Part < 0 || Part >= NumParts || PartSize < 0 || PartSize > MAX_SNAPSHOT_PACKSIZE)
				return;

			if(GameTick >= m_CurrentRecvTick)
			{
				if(GameTick != m_CurrentRecvTick)
				{
					m_SnapshotParts = 0;
					m_CurrentRecvTick = GameTick;
				}

				// TODO: clean this up abit
				mem_copy((char*)m_aSnapshotIncomingData + Part*MAX_SNAPSHOT_PACKSIZE, pData, PartSize);
				m_SnapshotParts |= 1<<Part;

				if(m_SnapshotParts == (unsigned)((1<<NumParts)-1))
				{
					static CSnapshot Emptysnap;
					CSnapshot *pDeltaShot = &Emptysnap;
					int PurgeTick;
					int DeltaSize;
					unsigned char aTmpBuffer2[CSnapshot::MAX_SIZE];
					unsigned char aTmpBuffer3[CSnapshot::MAX_SIZE];
					CSnapshot *pTmpBuffer3 = (CSnapshot*)aTmpBuffer3;	// Fix compiler warning for strict-aliasing
					int SnapSize;

					CompleteSize = (NumParts-1) * MAX_SNAPSHOT_PACKSIZE + PartSize;

					// reset snapshoting
					m_SnapshotParts = 0;

					// find snapshot that we should use as delta
					Emptysnap.Clear();

					// find delta
					if(DeltaTick >= 0)
					{
						int DeltashotSize = m_SnapshotStorage.Get(DeltaTick, 0, &pDeltaShot, 0);

						if(DeltashotSize < 0)
						{
							// couldn't find the delta snapshots that the server used
							// to compress this snapshot. force the server to resync
							if(Config()->m_Debug)
							{
								char aBuf[256];
								str_format(aBuf, sizeof(aBuf), "error, couldn't find the delta snapshot");
								m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
							}

							// ack snapshot
							// TODO: combine this with the input message
							m_AckGameTick = -1;
							return;
						}
					}

					// decompress snapshot
					const void *pDeltaData = m_SnapshotDelta.EmptyDelta();
					DeltaSize = sizeof(int)*3;

					if(CompleteSize)
					{
						int IntSize = CVariableInt::Decompress(m_aSnapshotIncomingData, CompleteSize, aTmpBuffer2, sizeof(aTmpBuffer2));

						if(IntSize < 0) // failure during decompression, bail
							return;

						pDeltaData = aTmpBuffer2;
						DeltaSize = IntSize;
					}

					// unpack delta
					SnapSize = m_SnapshotDelta.UnpackDelta(pDeltaShot, pTmpBuffer3, pDeltaData, DeltaSize);
					if(SnapSize < 0)
					{
						char aBuf[64];
						str_format(aBuf, sizeof(aBuf), "delta unpack failed! (%d)", SnapSize);
						m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						return;
					}

					if(Msg != NETMSG_SNAPEMPTY && pTmpBuffer3->Crc() != Crc)
					{
						if(Config()->m_Debug)
						{
							char aBuf[256];
							str_format(aBuf, sizeof(aBuf), "snapshot crc error #%d - tick=%d wantedcrc=%d gotcrc=%d compressed_size=%d delta_tick=%d",
								m_SnapCrcErrors, GameTick, Crc, pTmpBuffer3->Crc(), CompleteSize, DeltaTick);
							m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client", aBuf);
						}

						m_SnapCrcErrors++;
						if(m_SnapCrcErrors > 10)
						{
							// to many errors, send reset
							m_AckGameTick = -1;
							SendInput();
							m_SnapCrcErrors = 0;
						}
						return;
					}
					else
					{
						if(m_SnapCrcErrors)
							m_SnapCrcErrors--;
					}

					// purge old snapshots
					PurgeTick = DeltaTick;
					if(m_aSnapshots[SNAP_PREV] && m_aSnapshots[SNAP_PREV]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_PREV]->m_Tick;
					if(m_aSnapshots[SNAP_CURRENT] && m_aSnapshots[SNAP_CURRENT]->m_Tick < PurgeTick)
						PurgeTick = m_aSnapshots[SNAP_CURRENT]->m_Tick;
					m_SnapshotStorage.PurgeUntil(PurgeTick);

					// add new
					m_SnapshotStorage.Add(GameTick, time_get(), SnapSize, pTmpBuffer3, 1);

					// add snapshot to demo
					if(m_DemoRecorder.IsRecording())
					{
						// build up snapshot and add local messages
						m_DemoRecSnapshotBuilder.Init(pTmpBuffer3);
						GameClient()->OnDemoRecSnap();
						SnapSize = m_DemoRecSnapshotBuilder.Finish(pTmpBuffer3);

						// write snapshot
						m_DemoRecorder.RecordSnapshot(GameTick, pTmpBuffer3, SnapSize);
					}

					// apply snapshot, cycle pointers
					m_ReceivedSnapshots++;

					m_CurrentRecvTick = GameTick;

					// we got two snapshots until we see us self as connected
					if(m_ReceivedSnapshots == 2)
					{
						// start at 200ms and work from there
						m_PredictedTime.Init(GameTick*time_freq()/50);
						m_PredictedTime.SetAdjustSpeed(1, 1000.0f);
						m_GameTime.Init((GameTick-1)*time_freq()/50);
						m_aSnapshots[SNAP_PREV] = m_SnapshotStorage.m_pFirst;
						m_aSnapshots[SNAP_CURRENT] = m_SnapshotStorage.m_pLast;
						SetState(IClient::STATE_ONLINE);
					}

					// adjust game time
					if(m_ReceivedSnapshots > 2)
					{
						int64 Now = m_GameTime.Get(time_get());
						int64 TickStart = GameTick*time_freq()/50;
						int64 TimeLeft = (TickStart-Now)*1000 / time_freq();
						m_GameTime.Update(&m_GametimeMarginGraph, (GameTick-1)*time_freq()/50, TimeLeft, 0);
					}

					// ack snapshot
					m_AckGameTick = GameTick;
				}
			}
		}
	}
	else
	{
		if((pPacket->m_Flags&NET_CHUNKFLAG_VITAL) != 0)
		{
			// game message
			GameClient()->OnMessage(Msg, &Unpacker);

			if(m_RecordGameMessage && m_DemoRecorder.IsRecording())
				m_DemoRecorder.RecordMessage(pPacket->m_pData, pPacket->m_DataSize);
		}
	}
}